

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gfp.c
# Opt level: O2

bool_t gfpCreate(qr_o *r,octet *p,size_t no,void *stack)

{
  bool_t bVar1;
  
  bVar1 = 0;
  if (((no != 0) && ((*p & 1) != 0)) && (no != 1 || *p != 1)) {
    zmCreate(r,p,no,stack);
    bVar1 = 1;
  }
  return bVar1;
}

Assistant:

bool_t gfpCreate(qr_o* r, const octet p[], size_t no, void* stack)
{
	ASSERT(memIsValid(r, sizeof(*r)));
	ASSERT(memIsValid(p, no));
	ASSERT(no > 0 && p[no - 1] > 0);
	// p -- четное или p == 1?
	if (no == 0 || p[0] % 2 == 0 || no == 1 && p[0] == 1)
		return FALSE;
	// создать GF(p) как ZZ / (p)
	zmCreate(r, p, no, stack);
	return TRUE;
}